

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O0

void google::protobuf::compiler::cxx::anon_unknown_3::SetStringVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  Options *pOVar1;
  Type TVar2;
  mapped_type *pmVar3;
  FieldDescriptor *field;
  undefined1 auVar4 [16];
  char *local_1e0;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  key_type local_150;
  byte local_12a;
  byte local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  byte local_e2;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_98;
  allocator<char> local_61;
  key_type local_60;
  string local_40;
  Options *local_20;
  Options *options_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  FieldDescriptor *descriptor_local;
  
  local_20 = options;
  options_local = (Options *)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)descriptor;
  SetCommonFieldVariables(descriptor,variables,options);
  DefaultValue_abi_cxx11_(&local_40,(cxx *)variables_local,field);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"default",&local_61);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_60);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)&local_40);
  FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)variables_local);
  auVar4 = std::__cxx11::string::length();
  SimpleItoa_abi_cxx11_(&local_98,auVar4._0_8_,auVar4._8_8_);
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"default_length",&local_b9)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_98);
  FieldDescriptor::default_value_string_abi_cxx11_((FieldDescriptor *)variables_local);
  auVar4 = std::__cxx11::string::empty();
  local_e2 = 0;
  local_129 = 0;
  local_12a = 0;
  if ((auVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    FieldName_abi_cxx11_(&local_128,(cxx *)variables_local,auVar4._8_8_);
    local_129 = 1;
    std::operator+(&local_108,"_default_",&local_128);
    local_12a = 1;
    std::operator+(&local_e0,&local_108,"_");
  }
  else {
    std::allocator<char>::allocator();
    local_e2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"&::google::protobuf::internal::kEmptyString",&local_e1);
  }
  pOVar1 = options_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"default_variable",&local_151);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_150);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_e0);
  if ((local_12a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_108);
  }
  if ((local_129 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  if ((local_e2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_e1);
  }
  TVar2 = FieldDescriptor::type((FieldDescriptor *)variables_local);
  pOVar1 = options_local;
  if (TVar2 == TYPE_BYTES) {
    local_1e0 = "void";
  }
  else {
    local_1e0 = "char";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"pointer_type",&local_179)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pOVar1,&local_178);
  std::__cxx11::string::operator=((string *)pmVar3,local_1e0);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  return;
}

Assistant:

void SetStringVariables(const FieldDescriptor* descriptor,
                        map<string, string>* variables,
                        const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["default"] = DefaultValue(descriptor);
  (*variables)["default_length"] =
      SimpleItoa(descriptor->default_value_string().length());
  (*variables)["default_variable"] = descriptor->default_value_string().empty()
      ? "&::google::protobuf::internal::kEmptyString"
      : "_default_" + FieldName(descriptor) + "_";
  (*variables)["pointer_type"] =
      descriptor->type() == FieldDescriptor::TYPE_BYTES ? "void" : "char";
}